

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skins.cpp
# Opt level: O0

bool __thiscall
CSkins::ValidateSkinParts
          (CSkins *this,char **apPartNames,int *pUseCustomColors,int *pPartColors,int GameFlags)

{
  vec3 HSL;
  vec3 HSL_00;
  undefined8 uVar1;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 aVar2;
  int iVar3;
  uint *in_RCX;
  int *in_RDX;
  uint in_R8D;
  long in_FS_OFFSET;
  float fVar4;
  vec3 vVar5;
  int EyeColor;
  int BodyColor;
  vec3 EyeLab_1;
  vec3 OrgEyeHsl_1;
  vec3 EyeLab;
  vec3 OrgEyeHsl;
  vec3 BodyLab;
  vec3 EyeHsl;
  vec3 BodyHsl;
  char *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  uint uVar6;
  uint uVar7;
  bool local_199;
  undefined8 in_stack_fffffffffffffe78;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 in_stack_fffffffffffffe80;
  vec3 in_stack_fffffffffffffe88;
  anon_union_4_3_4e90b46e_for_vector3_base<float>_1 local_130;
  anon_union_4_3_4e90b0cd_for_vector3_base<float>_3 aStack_12c;
  vector3_base<float> local_124;
  vec3 local_118;
  undefined8 local_108;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 local_100;
  vec3 local_f8;
  vector3_base<float> local_e8;
  vector3_base<float> local_d8;
  undefined8 local_c8;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 local_c0;
  undefined8 local_bc;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 local_b4;
  anon_union_4_3_4e90b46e_for_vector3_base<float>_1 local_b0;
  anon_union_4_3_4e90b0cd_for_vector3_base<float>_3 aStack_ac;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 local_a8;
  vector3_base<float> local_a4;
  vec3 local_98;
  undefined8 local_88;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 local_80;
  vec3 local_78;
  vector3_base<float> local_68;
  vector3_base<float> local_58;
  undefined8 local_48;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 local_40;
  undefined8 local_38;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 local_30;
  vector3_base<float> local_2c;
  vector3_base<float> local_20;
  vector3_base<float> local_14;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_R8D & 1) == 0) {
    uVar7 = *in_RCX;
    uVar6 = in_RCX[5];
    vector3_base<float>::vector3_base
              (&local_14,(float)((int)uVar7 >> 0x10 & 0xff) / 255.0,
               (float)((int)uVar7 >> 8 & 0xff) / 255.0,(float)(uVar7 & 0xff) / 255.0);
    vector3_base<float>::vector3_base
              (&local_20,(float)((int)uVar6 >> 0x10 & 0xff) / 255.0,
               (float)((int)uVar6 >> 8 & 0xff) / 255.0,(float)(uVar6 & 0xff) / 255.0);
    if (*in_RDX == 0) {
      vector3_base<float>::vector3_base(&local_2c,0.0,0.0,1.0);
      local_14.field_0 = local_2c.field_0;
      local_14.field_1 = local_2c.field_1;
      local_14.field_2 = local_2c.field_2;
    }
    local_58.field_2 = local_14.field_2;
    local_58.field_0 = local_14.field_0;
    local_58.field_1 = local_14.field_1;
    local_68.field_2 = local_14.field_2;
    local_68.field_0 = local_14.field_0;
    local_68.field_1 = local_14.field_1;
    vVar5.field_2 = in_stack_fffffffffffffe80;
    vVar5.field_0 =
         (anon_union_4_3_4e90b46e_for_vector3_base<float>_1)(int)in_stack_fffffffffffffe78;
    vVar5.field_1 =
         (anon_union_4_3_4e90b0cd_for_vector3_base<float>_3)
         (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
    vVar5 = HslToRgb(vVar5);
    local_78.field_2 = vVar5.field_2;
    local_40 = local_78.field_2;
    local_78._0_8_ = vVar5._0_8_;
    local_48._0_4_ = local_78.field_0;
    local_48._4_4_ = local_78.field_1;
    local_80 = local_78.field_2;
    local_88._0_4_ = local_78.field_0;
    local_88._4_4_ = local_78.field_1;
    local_78 = vVar5;
    vVar5 = RgbToLab(in_stack_fffffffffffffe88);
    local_98._0_8_ = vVar5._0_8_;
    local_38._0_4_ = local_98.field_0;
    local_38._4_4_ = local_98.field_1;
    local_98.field_2 = vVar5.field_2;
    local_30 = local_98.field_2;
    local_98 = vVar5;
    iVar3 = str_comp((char *)CONCAT44(uVar6,in_stack_fffffffffffffe30),in_stack_fffffffffffffe28);
    if (iVar3 == 0) {
      if (in_RDX[5] == 0) {
        vector3_base<float>::vector3_base(&local_a4,0.0,0.0,1.0);
        local_20.field_0 = local_a4.field_0;
        local_20.field_1 = local_a4.field_1;
        local_20.field_2 = local_a4.field_2;
      }
      local_a8.z = local_20.field_2.z;
      local_b0 = local_20.field_0;
      aStack_ac = local_20.field_1;
      local_e8.field_2.z = local_20.field_2.z * 0.925;
      local_d8.field_0 = local_20.field_0;
      local_d8.field_1 = local_20.field_1;
      local_e8.field_0 = local_20.field_0;
      local_e8.field_1 = local_20.field_1;
      HSL.field_2 = in_stack_fffffffffffffe80;
      HSL.field_0 = (anon_union_4_3_4e90b46e_for_vector3_base<float>_1)
                    (int)in_stack_fffffffffffffe78;
      HSL.field_1 = (anon_union_4_3_4e90b0cd_for_vector3_base<float>_3)
                    (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
      local_d8.field_2.z = local_e8.field_2.z;
      local_20.field_2.z = local_e8.field_2.z;
      vVar5 = HslToRgb(HSL);
      local_f8.field_2 = vVar5.field_2;
      local_c0 = local_f8.field_2;
      local_f8._0_8_ = vVar5._0_8_;
      local_c8._0_4_ = local_f8.field_0;
      local_c8._4_4_ = local_f8.field_1;
      local_100 = local_f8.field_2;
      local_108._0_4_ = local_f8.field_0;
      local_108._4_4_ = local_f8.field_1;
      local_f8 = vVar5;
      vVar5 = RgbToLab(in_stack_fffffffffffffe88);
      local_118._0_8_ = vVar5._0_8_;
      local_bc._0_4_ = local_118.field_0;
      local_bc._4_4_ = local_118.field_1;
      local_118.field_2 = vVar5.field_2;
      local_b4 = local_118.field_2;
      local_118 = vVar5;
      fVar4 = distance<float>((vector3_base<float> *)CONCAT44(in_R8D,uVar7),
                              (vector3_base<float> *)CONCAT44(uVar6,in_stack_fffffffffffffe30));
      if (fVar4 < 80.0) {
        local_a8.z = clamp<float>(local_a8.z - 0.22,0.0,1.0);
        if (0.23921569 <= local_a8.z) {
          in_RDX[5] = 1;
          in_RCX[5] = (int)(local_b0.x * 255.0) << 0x10 | (int)(aStack_ac.y * 255.0) << 8 |
                      (int)(local_a8.z * 255.0);
        }
        else {
          str_copy((char *)CONCAT44(uVar6,in_stack_fffffffffffffe30),in_stack_fffffffffffffe28,0);
        }
        local_199 = false;
        goto LAB_001bfd91;
      }
    }
    else {
      iVar3 = str_comp((char *)CONCAT44(uVar6,in_stack_fffffffffffffe30),in_stack_fffffffffffffe28);
      if (iVar3 == 0) {
        if (in_RDX[5] == 0) {
          vector3_base<float>::vector3_base(&local_124,0.0,0.0,1.0);
          local_20.field_0 = local_124.field_0;
          local_20.field_1 = local_124.field_1;
          local_20.field_2 = local_124.field_2;
        }
        aVar2 = local_20.field_2;
        uVar1 = local_20._0_8_;
        local_20.field_2.z = clamp<float>(local_20.field_2.z * 0.0823,0.0,1.0);
        HSL_00.field_2 = in_stack_fffffffffffffe80;
        HSL_00.field_0 =
             (anon_union_4_3_4e90b46e_for_vector3_base<float>_1)(int)in_stack_fffffffffffffe78;
        HSL_00.field_1 =
             (anon_union_4_3_4e90b0cd_for_vector3_base<float>_3)
             (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
        vVar5 = HslToRgb(HSL_00);
        RgbToLab(vVar5);
        fVar4 = distance<float>((vector3_base<float> *)CONCAT44(in_R8D,uVar7),
                                (vector3_base<float> *)CONCAT44(uVar6,in_stack_fffffffffffffe30));
        if (fVar4 < 80.0) {
          fVar4 = clamp<float>(aVar2.z - 0.6,0.0,1.0);
          in_RDX[5] = 1;
          local_130 = SUB84(uVar1,0);
          aStack_12c = SUB84(uVar1,4);
          in_RCX[5] = (int)(local_130.x * 255.0) << 0x10 | (int)(aStack_12c.y * 255.0) << 8 |
                      (int)(fVar4 * 255.0);
          local_199 = false;
          goto LAB_001bfd91;
        }
      }
    }
  }
  else {
    iVar3 = str_comp((char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     in_stack_fffffffffffffe28);
    if ((iVar3 == 0) ||
       (iVar3 = str_comp((char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                         in_stack_fffffffffffffe28), iVar3 == 0)) {
      str_copy((char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe28,0);
      local_199 = false;
      goto LAB_001bfd91;
    }
  }
  local_199 = true;
LAB_001bfd91:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_199;
}

Assistant:

bool CSkins::ValidateSkinParts(char *apPartNames[NUM_SKINPARTS], int *pUseCustomColors, int *pPartColors, int GameFlags) const
{
	// force standard (black) eyes on team skins
	if(GameFlags&GAMEFLAG_TEAMS)
	{
		// TODO: adjust eye color here as well?
		if(str_comp(apPartNames[SKINPART_EYES], "colorable") == 0 || str_comp(apPartNames[SKINPART_EYES], "negative") == 0)
		{
			str_copy(apPartNames[SKINPART_EYES], "standard", MAX_SKIN_ARRAY_SIZE);
			return false;
		}
	}
	else
	{
		const int BodyColor = pPartColors[SKINPART_BODY];
		const int EyeColor = pPartColors[SKINPART_EYES];

		vec3 BodyHsl(((BodyColor>>16)&0xff)/255.0f, ((BodyColor>>8)&0xff)/255.0f, (BodyColor&0xff)/255.0f);
		vec3 EyeHsl(((EyeColor>>16)&0xff)/255.0f, ((EyeColor>>8)&0xff)/255.0f, (EyeColor&0xff)/255.0f);

		if(!pUseCustomColors[SKINPART_BODY])
			BodyHsl = vec3(0, 0, 1);

		const vec3 BodyLab = RgbToLab(HslToRgb(BodyHsl));

		if(str_comp(apPartNames[SKINPART_EYES], "negative") == 0)
		{
			if(!pUseCustomColors[SKINPART_EYES])
				EyeHsl = vec3(0, 0, 1);

			vec3 OrgEyeHsl = EyeHsl;
			EyeHsl.l *= 0.925f;

			const vec3 EyeLab = RgbToLab(HslToRgb(EyeHsl));
			if(distance(BodyLab, EyeLab) < MIN_EYE_BODY_COLOR_DIST)
			{
				OrgEyeHsl.l = clamp(OrgEyeHsl.l - 0.22f, 0.f, 1.f);

				// white eye can't go to black because of our DARKEST_COLOR_LGT restriction, so switch to standard (black) eyes
				if(OrgEyeHsl.l < DARKEST_COLOR_LGT/255.f)
					str_copy(apPartNames[SKINPART_EYES], "standard", MAX_SKIN_ARRAY_SIZE); // black
				else
				{
					pUseCustomColors[SKINPART_EYES] = 1;
					pPartColors[SKINPART_EYES] = (int(OrgEyeHsl.h*255) << 16) | (int(OrgEyeHsl.s*255) << 8) | (int(OrgEyeHsl.l*255));
				}

				return false;
			}
		}
		else if(str_comp(apPartNames[SKINPART_EYES], "colorable") == 0)
		{
			if(!pUseCustomColors[SKINPART_EYES])
				EyeHsl = vec3(0, 0, 1);

			vec3 OrgEyeHsl = EyeHsl;
			EyeHsl.l = clamp(EyeHsl.l * 0.0823f, 0.f, 1.f);

			const vec3 EyeLab = RgbToLab(HslToRgb(EyeHsl));
			if(distance(BodyLab, EyeLab) < MIN_EYE_BODY_COLOR_DIST)
			{
				OrgEyeHsl.l -= 0.6f;
				OrgEyeHsl.l = clamp(OrgEyeHsl.l, 0.f, 1.f);

				pUseCustomColors[SKINPART_EYES] = 1;
				pPartColors[SKINPART_EYES] = (int(OrgEyeHsl.h*255) << 16) | (int(OrgEyeHsl.s*255) << 8) | (int(OrgEyeHsl.l*255));

				return false;
			}
		}
	}

	return true;
}